

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

uint md_link_label_hash(MD_CHAR *label,MD_SIZE size)

{
  char cVar1;
  MD_OFFSET off;
  uint codepoint;
  int iVar2;
  uint base;
  long in_FS_OFFSET;
  MD_SIZE char_size;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  off = md_skip_unicode_whitespace(label,0,size);
  base = 0x811c9dc5;
  while( true ) {
    if (size < off || size - off == 0) break;
    char_size = 0xaaaaaaaa;
    codepoint = md_decode_utf8__(label + off,size - off,&char_size);
    iVar2 = md_is_unicode_whitespace__(codepoint);
    if (((iVar2 == 0) && (cVar1 = label[off], cVar1 != '\r')) && (cVar1 != '\n')) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      md_get_unicode_fold_info(codepoint,(MD_UNICODE_FOLD_INFO *)&local_48);
      base = md_fnv1a(base,(MD_UNICODE_FOLD_INFO *)&local_48,((ulong)puStack_40 >> 0x20) << 2);
      off = off + char_size;
    }
    else {
      local_4c = 0x20;
      base = md_fnv1a(base,&local_4c,4);
      off = md_skip_unicode_whitespace(label,off,size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return base;
  }
  __stack_chk_fail();
}

Assistant:

static unsigned
md_link_label_hash(const CHAR* label, SZ size)
{
    unsigned hash = MD_FNV1A_BASE;
    OFF off;
    unsigned codepoint;
    int is_whitespace = FALSE;

    off = md_skip_unicode_whitespace(label, 0, size);
    while(off < size) {
        SZ char_size;

        codepoint = md_decode_unicode(label, off, size, &char_size);
        is_whitespace = ISUNICODEWHITESPACE_(codepoint) || ISNEWLINE_(label[off]);

        if(is_whitespace) {
            codepoint = ' ';
            hash = md_fnv1a(hash, &codepoint, sizeof(unsigned));
            off = md_skip_unicode_whitespace(label, off, size);
        } else {
            MD_UNICODE_FOLD_INFO fold_info;

            md_get_unicode_fold_info(codepoint, &fold_info);
            hash = md_fnv1a(hash, fold_info.codepoints, fold_info.n_codepoints * sizeof(unsigned));
            off += char_size;
        }
    }

    return hash;
}